

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.c
# Opt level: O0

void BuildTree(char *rawSourceCode)

{
  Token TVar1;
  uint len;
  int iVar2;
  int iVar3;
  int iVar4;
  uint totalParamItems_00;
  RunnerContext *pRVar5;
  ASTList *pAVar6;
  ASTList *pAVar7;
  ASTNode *pAVar8;
  anon_union_8_9_f6e6a019_for_value aStack_1e0;
  undefined1 auStack_1d8 [16];
  ASTList *local_1c8;
  ASTList *local_1c0;
  ASTNode *local_1b8;
  ASTNode *local_1b0;
  int local_1a4;
  ulong uStack_1a0;
  int i_2;
  unsigned_long __vla_expr5;
  unsigned_long __vla_expr4;
  Runner runner;
  int i_1;
  int totalVars;
  Scope scope;
  int i;
  unsigned_long __vla_expr3;
  unsigned_long __vla_expr2;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  int totalParamItems;
  int totalFuncCalls;
  int totalFuncs;
  int totalScopes;
  int totalNodes;
  Lexer lexer;
  Clock clock;
  char *rawSourceCode_local;
  
  aStack_1e0 = (anon_union_8_9_f6e6a019_for_value)0x103278;
  StartClock((Clock *)&lexer.currentTokenString);
  auStack_1d8._8_8_ = &totalScopes;
  aStack_1e0 = (anon_union_8_9_f6e6a019_for_value)0x10328f;
  InitLexer((Lexer *)auStack_1d8._8_8_,rawSourceCode);
  aStack_1e0 = (anon_union_8_9_f6e6a019_for_value)0x10329b;
  len = CountTotalASTTokens((Lexer *)auStack_1d8._8_8_);
  aStack_1e0 = (anon_union_8_9_f6e6a019_for_value)0x1032ad;
  ResetLexer((Lexer *)auStack_1d8._8_8_);
  aStack_1e0 = (anon_union_8_9_f6e6a019_for_value)0x1032b9;
  iVar2 = CountTotalScopes((Lexer *)auStack_1d8._8_8_);
  aStack_1e0 = (anon_union_8_9_f6e6a019_for_value)0x1032cb;
  ResetLexer((Lexer *)auStack_1d8._8_8_);
  aStack_1e0 = (anon_union_8_9_f6e6a019_for_value)0x1032d7;
  iVar3 = CountTotalFuncs((Lexer *)auStack_1d8._8_8_);
  aStack_1e0 = (anon_union_8_9_f6e6a019_for_value)0x1032e9;
  ResetLexer((Lexer *)auStack_1d8._8_8_);
  aStack_1e0 = (anon_union_8_9_f6e6a019_for_value)0x1032f5;
  iVar4 = CountTotalFuncCalls((Lexer *)auStack_1d8._8_8_);
  aStack_1e0 = (anon_union_8_9_f6e6a019_for_value)0x103307;
  ResetLexer((Lexer *)auStack_1d8._8_8_);
  aStack_1e0 = (anon_union_8_9_f6e6a019_for_value)0x103313;
  totalParamItems_00 = CountTotalParamItems((Lexer *)auStack_1d8._8_8_);
  aStack_1e0 = (anon_union_8_9_f6e6a019_for_value)0x103325;
  ResetLexer((Lexer *)auStack_1d8._8_8_);
  pAVar7 = (ASTList *)(auStack_1d8 + (ulong)(uint)(iVar3 + iVar4) * -0x20);
  pAVar6 = (ASTList *)((long)pAVar7 - ((ulong)totalParamItems_00 * 0x18 + 0xf & 0xfffffffffffffff0))
  ;
  local_1c8 = pAVar7;
  local_1c0 = pAVar6;
  pAVar6[-1].size = 0x10339b;
  pAVar6[-1].nodeId = 0;
  InitParams(pAVar7,iVar3 + iVar4);
  pAVar7 = local_1c0;
  pAVar6[-1].size = 0x1033ad;
  pAVar6[-1].nodeId = 0;
  InitParamItems((ASTListItem *)pAVar7,totalParamItems_00);
  pAVar8 = (ASTNode *)((long)pAVar6 - ((ulong)len * 0x38 + 0xf & 0xfffffffffffffff0));
  local_1b8 = pAVar8;
  pAVar8[-1].meta.funcExpr.params = (ASTList *)0x1033e1;
  InitNodes(pAVar8,len);
  pAVar8 = (ASTNode *)((long)pAVar8 - ((ulong)(iVar2 + 1) * 4 + 0xf & 0xfffffffffffffff0));
  for (scope.paramItems._4_4_ = 0; scope.paramItems._4_4_ < iVar2 + 1;
      scope.paramItems._4_4_ = scope.paramItems._4_4_ + 1) {
    (&pAVar8->type)[scope.paramItems._4_4_] = scope.paramItems._4_4_ + NUMBER;
  }
  local_1b0 = pAVar8;
  pAVar8[-1].meta.funcExpr.params = (ASTList *)0x103460;
  InitScope((Scope *)&i_1);
  scope._24_8_ = local_1b8;
  scope.nodes = local_1b0;
  scope.scopes = (int *)local_1c8;
  scope.params = local_1c0;
  scope.scopeLength = iVar3 + iVar4;
  TVar1 = (&local_1b0->type)[scope.nodeLength];
  totalVars = len;
  scope.nodeSpot = iVar2;
  scope.nodeLength = scope.nodeLength + 1;
  scope.paramsLength = totalParamItems_00;
  pAVar8[-1].meta.funcExpr.params = (ASTList *)0x103501;
  ParseStmtList((Scope *)&i_1,(Lexer *)&totalScopes,TVar1,false);
  i_1 = 0;
  pAVar8[-1].meta.funcExpr.params = (ASTList *)0x10351c;
  EnsureSemantics((Scope *)&i_1,1);
  runner._36_4_ = 0;
  for (runner.totalContexts = 0; runner.totalContexts < totalVars;
      runner.totalContexts = runner.totalContexts + 1) {
    if (((*(int *)(scope._24_8_ + (long)runner.totalContexts * 0x38) == 0x68) ||
        (*(int *)(scope._24_8_ + (long)runner.totalContexts * 0x38) == 0x60)) ||
       ((0x3f < *(uint *)(scope._24_8_ + (long)runner.totalContexts * 0x38) &&
        (*(uint *)(scope._24_8_ + (long)runner.totalContexts * 0x38) < 0x4b)))) {
      runner._36_4_ = runner._36_4_ + 1;
    }
  }
  __vla_expr5 = (unsigned_long)(uint)runner._36_4_;
  runner.currentNode = (ASTNode *)((long)pAVar8 - (__vla_expr5 * 0x18 + 0xf & 0xfffffffffffffff0));
  uStack_1a0 = (ulong)(uint)runner._36_4_;
  pRVar5 = (RunnerContext *)((long)runner.currentNode - (uStack_1a0 + 0xf & 0xfffffffffffffff0));
  for (local_1a4 = 0; local_1a4 < (int)runner._36_4_; local_1a4 = local_1a4 + 1) {
    *(undefined1 *)((long)&pRVar5->node + (long)local_1a4) = 0;
  }
  runner.contextUsed._0_4_ = runner._36_4_;
  runner.contexts = pRVar5;
  pRVar5[-1].value.vDouble = 5.249595706757e-318;
  InitRunner((Runner *)&__vla_expr4,(Scope *)&i_1);
  TVar1 = (scope.nodes)->type;
  pRVar5[-1].value.vDouble = 5.24969946054262e-318;
  Run((Runner *)&__vla_expr4,TVar1);
  pRVar5[-1].value.vDouble = 5.24975874842012e-318;
  DestroyLexer((Lexer *)&totalScopes);
  pAVar8 = local_1b8;
  pRVar5[-1].value.vDouble = 5.24984768023638e-318;
  DestroyNodes(pAVar8,len);
  pRVar5[-1].value.vDouble = 5.24990696811388e-318;
  DestroyScope((Scope *)&i_1);
  pRVar5[-1].value.vDouble = 5.249951434022e-318;
  EndClock((Clock *)&lexer.currentTokenString);
  return;
}

Assistant:

void BuildTree(char* rawSourceCode){
	Clock clock;
	StartClock(&clock);

	DEBUG_PRINT("\n\n------Starting Program------\n");

	// Build Lexer
	Lexer lexer;
	InitLexer(&lexer, rawSourceCode);

	// Pre-allocate memory
	// The heap is 3,000% slower than just using stack
	// memory. So we are pre-allocating the memory
	// using the stack
	int totalNodes = CountTotalASTTokens(&lexer);
	ResetLexer(&lexer);
	int totalScopes = CountTotalScopes(&lexer);
	ResetLexer(&lexer);
	int totalFuncs = CountTotalFuncs(&lexer);
	ResetLexer(&lexer);
	int totalFuncCalls = CountTotalFuncCalls(&lexer);
	ResetLexer(&lexer);
	int totalParamItems = CountTotalParamItems(&lexer);
	ResetLexer(&lexer);

	// Pre-allocate the different param lists
	ASTList params[totalFuncs + totalFuncCalls];
	ASTListItem paramItems[totalParamItems];
	InitParams(params, totalFuncs + totalFuncCalls);
	InitParamItems(paramItems, totalParamItems);

	// Pre-allocate the different variable types
	ASTNode nodes[totalNodes];
	InitNodes(nodes, totalNodes);

	// Pre-allocate the different scopes
	int scopes[totalScopes + 1];
	for (int i = 0; i < totalScopes + 1; i++) scopes[i] = i + 1;

	// Build the scope
	Scope scope;
	InitScope(&scope);
	scope.nodeLength = totalNodes;
	scope.nodes = nodes;
	scope.scopeLength = totalScopes;
	scope.scopes = scopes;

	scope.params = params;
	scope.paramItems = paramItems;
	scope.paramsLength = totalFuncs + totalFuncCalls;
	scope.paramItemsLength = totalParamItems;

	// Let's build the tree
	ParseStmtList(&scope, &lexer, scope.scopes[scope.scopeSpot++], false);
	scope.nodeSpot = 0;
	EnsureSemantics(&scope, 1);

	#if EXPAND_AST
	char* json = ExpandScope(&scope, 0);
	WriteToFile("compiled.json", json);
	#endif

	int totalVars = 0;
	for (int i = 0; i < scope.nodeLength; i++){
		if (scope.nodes[i].type == VAR ||
				scope.nodes[i].type == RETURN ||
				(scope.nodes[i].type > BEGIN_NUMBER && 
				 scope.nodes[i].type < END_STRING)) totalVars++;
	}

	Runner runner;
	RunnerContext runnerContexts[totalVars];
	runner.contexts = runnerContexts;
	bool contextUsed[totalVars];
	runner.contextUsed = contextUsed;

	for (int i = 0; i < totalVars; i++) {
		runner.contextUsed[i] = false;
	}

	runner.totalContexts = totalVars;
	InitRunner(&runner, &scope);
	Run(&runner, scope.scopes[0]);


	// Cleanup
	DestroyLexer(&lexer);
	DestroyNodes(nodes, totalNodes);
	DestroyScope(&scope);

	EndClock(&clock);
	DEBUG_PRINT("\n\n------Program Completed------\n");
	DEBUG_PRINT("\n\n------Program Stats------\n");
	#if DEBUG == 1
	printf("Time: %lld nanoseconds\n", GetClockNanosecond(&clock));
	
	#endif
}